

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O1

ssl_open_record_t __thiscall
bssl::dtls1_open_app_data
          (bssl *this,SSL *ssl,Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,
          Span<unsigned_char> in)

{
  ushort *puVar1;
  Span<unsigned_char> in_00;
  Span<const_unsigned_char> data;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  ssl_open_record_t sVar5;
  undefined7 extraout_var;
  uchar *in_R9;
  size_t *psVar6;
  Span<const_unsigned_char> record_00;
  uint8_t type;
  Span<unsigned_char> record;
  DTLSRecordNumber record_number;
  hm_header_st msg_hdr;
  CBS body;
  CBS cbs;
  size_t in_stack_ffffffffffffff58;
  undefined1 local_99 [45];
  ushort local_6c;
  int local_68;
  uint8_t *local_60;
  CBS local_50;
  CBS local_40;
  
  iVar4 = SSL_in_init((SSL *)this);
  if (iVar4 != 0) {
    __assert_fail("!SSL_in_init(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xa3,
                  "ssl_open_record_t bssl::dtls1_open_app_data(SSL *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                 );
  }
  local_99._25_8_ = (uint8_t *)0x0;
  local_99._1_8_ = (SSL_PROTOCOL_METHOD *)0x0;
  local_99._9_8_ = (SSL_CONFIG *)0x0;
  in_00.size_ = in_stack_ffffffffffffff58;
  in_00.data_ = in_R9;
  psVar6 = out_consumed;
  local_60 = out_alert;
  sVar5 = dtls_open_record(this,(SSL *)local_99,local_99 + 0x19,(DTLSRecordNumber *)(local_99 + 1),
                           out,out_consumed,out_alert,in_00);
  if (sVar5 != ssl_open_record_success) {
    return sVar5;
  }
  if (local_99[0] == '\x16') {
    uVar3 = ssl_protocol_version((SSL *)this);
    if (0x303 < uVar3) {
      record_00.size_ = (size_t)psVar6;
      record_00.data_ = (uchar *)local_99._9_8_;
      bVar2 = dtls1_process_handshake_fragments
                        (this,(SSL *)out_consumed,(uint8_t *)local_99._25_8_,
                         (DTLSRecordNumber)local_99._1_8_,record_00);
      return (uint)!bVar2 + (uint)!bVar2 * 2 + ssl_open_record_discard;
    }
    local_40.data = (uint8_t *)local_99._1_8_;
    local_40.len = local_99._9_8_;
    bVar2 = dtls1_parse_fragment(&local_40,(hm_header_st *)(local_99 + 0x25),&local_50);
    sVar5 = (ssl_open_record_t)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      bVar2 = true;
      if ((local_99[0x25] == '\x14') &&
         (puVar1 = *(ushort **)(this + 0x38), puVar1[2] - 1 == (uint)local_6c)) {
        bVar2 = false;
        sVar5 = ssl_open_record_discard;
        if (((*puVar1 & 0x20) == 0) && (local_68 == 0)) {
          *(int *)(puVar1 + 0x1e6) = *(int *)(puVar1 + 0x1e6) + 1;
          *puVar1 = *puVar1 | 0x20;
          bVar2 = false;
        }
      }
    }
    else {
      bVar2 = false;
      ERR_put_error(0x10,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                    ,0xc3);
      *(undefined1 *)out_consumed = 0x32;
      sVar5 = ssl_open_record_error;
    }
    if (!bVar2) {
      return sVar5;
    }
  }
  if (local_99[0] == '\x17') {
    if ((SSL_CONFIG *)local_99._9_8_ == (SSL_CONFIG *)0x0) {
      sVar5 = ssl_open_record_discard;
    }
    else {
      ssl->method = (SSL_PROTOCOL_METHOD *)local_99._1_8_;
      (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl = (SSL_CONFIG *)local_99._9_8_;
      sVar5 = ssl_open_record_success;
    }
  }
  else if (local_99[0] == '\x1a') {
    data.size_ = local_99._9_8_;
    data.data_ = (uchar *)local_99._1_8_;
    sVar5 = dtls1_process_ack((SSL *)this,(uint8_t *)out_consumed,(DTLSRecordNumber)local_99._25_8_,
                              data);
  }
  else {
    ERR_put_error(0x10,0,0xe1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xe0);
    *(undefined1 *)out_consumed = 10;
    sVar5 = ssl_open_record_error;
  }
  return sVar5;
}

Assistant:

ssl_open_record_t dtls1_open_app_data(SSL *ssl, Span<uint8_t> *out,
                                      size_t *out_consumed, uint8_t *out_alert,
                                      Span<uint8_t> in) {
  assert(!SSL_in_init(ssl));

  uint8_t type;
  DTLSRecordNumber record_number;
  Span<uint8_t> record;
  auto ret = dtls_open_record(ssl, &type, &record_number, &record, out_consumed,
                              out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  if (type == SSL3_RT_HANDSHAKE) {
    // Process handshake fragments for DTLS 1.3 post-handshake messages.
    if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (!dtls1_process_handshake_fragments(ssl, out_alert, record_number,
                                             record)) {
        return ssl_open_record_error;
      }
      return ssl_open_record_discard;
    }

    // Parse the first fragment header to determine if this is a pre-CCS or
    // post-CCS handshake record. DTLS resets handshake message numbers on each
    // handshake, so renegotiations and retransmissions are ambiguous.
    //
    // TODO(crbug.com/42290594): Move this logic into
    // |dtls1_process_handshake_fragments| and integrate it into DTLS 1.3
    // retransmit conditions.
    CBS cbs, body;
    struct hm_header_st msg_hdr;
    CBS_init(&cbs, record.data(), record.size());
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return ssl_open_record_error;
    }

    if (msg_hdr.type == SSL3_MT_FINISHED &&
        msg_hdr.seq == ssl->d1->handshake_read_seq - 1) {
      if (!ssl->d1->sending_flight && msg_hdr.frag_off == 0) {
        // Retransmit our last flight of messages. If the peer sends the second
        // Finished, they may not have received ours. Only do this for the
        // first fragment, in case the Finished was fragmented.
        //
        // This is not really a timeout, but increment the timeout count so we
        // eventually give up.
        ssl->d1->num_timeouts++;
        ssl->d1->sending_flight = true;
      }
      return ssl_open_record_discard;
    }

    // Otherwise, this is a pre-CCS handshake message from an unsupported
    // renegotiation attempt. Fall through to the error path.
  }

  if (type == SSL3_RT_ACK) {
    return dtls1_process_ack(ssl, out_alert, record_number, record);
  }

  if (type != SSL3_RT_APPLICATION_DATA) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  if (record.empty()) {
    return ssl_open_record_discard;
  }

  *out = record;
  return ssl_open_record_success;
}